

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x2x.cc
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_2019::DataTransform<float,_double>::Run
          (DataTransform<float,_double> *this,istream *input_stream)

{
  double dVar1;
  NumericType NVar2;
  WarningType WVar3;
  ulong uVar4;
  ostream *poVar5;
  size_t *__idx;
  int iVar6;
  bool bVar7;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  longdouble in_ST7;
  double dVar8;
  allocator local_289;
  float input_data;
  float local_284;
  string *local_280;
  double local_278;
  double local_270;
  double local_268;
  undefined8 uStack_260;
  string local_250;
  string word;
  char buffer [128];
  
  local_280 = &this->print_format_;
  iVar6 = 0;
  do {
    if (this->is_ascii_input_ == true) {
      word._M_dataplus._M_p = (pointer)&word.field_2;
      word._M_string_length = 0;
      word.field_2._M_local_buf[0] = '\0';
      std::operator>>(input_stream,(string *)&word);
      bVar7 = word._M_string_length == 0;
      if (!bVar7) {
        std::__cxx11::stold((longdouble *)&word,(string *)0x0,__idx);
        input_data = (float)in_ST0;
        in_ST0 = in_ST1;
        in_ST1 = in_ST2;
        in_ST2 = in_ST3;
        in_ST3 = in_ST4;
        in_ST4 = in_ST5;
        in_ST5 = in_ST6;
        in_ST6 = in_ST7;
      }
      std::__cxx11::string::~string((string *)&word);
      if (!bVar7) goto LAB_00131485;
      if (bVar7) {
        if (!bVar7) {
          return false;
        }
        goto LAB_001316ec;
      }
    }
    else {
      bVar7 = sptk::ReadStream<float>(&input_data,input_stream);
      if (!bVar7) {
LAB_001316ec:
        if (this->is_ascii_output_ != true) {
          return true;
        }
        if (iVar6 % this->num_column_ != 0) {
          std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
          return true;
        }
        return true;
      }
LAB_00131485:
      dVar8 = this->minimum_value_;
      dVar1 = this->maximum_value_;
      if (dVar1 <= dVar8) {
LAB_00131632:
        dVar8 = (double)input_data;
        in_ST7 = in_ST6;
        if (this->rounding_ == true) {
          if (input_data <= 0.0) {
            dVar8 = dVar8 + -0.5;
          }
          else {
            dVar8 = dVar8 + 0.5;
          }
        }
      }
      else {
        NVar2 = this->input_numeric_type_;
        if (NVar2 == kFloatingPoint) {
          local_284 = input_data;
          in_ST6 = in_ST5;
          local_270 = dVar8;
          if ((input_data < (float)dVar8) ||
             (dVar8 = dVar1, local_278 = dVar1, (float)dVar1 < input_data)) goto LAB_001315b7;
          goto LAB_00131632;
        }
        if (NVar2 == kUnsignedInteger) {
          uVar4 = (long)(input_data - 9.223372e+18) & (long)input_data >> 0x3f | (long)input_data;
          if (((ulong)((long)(dVar8 - 9.223372036854776e+18) & (long)dVar8 >> 0x3f | (long)dVar8) <=
               uVar4) &&
             (dVar8 = dVar1,
             uVar4 <= (ulong)((long)(dVar1 - 9.223372036854776e+18) & (long)dVar1 >> 0x3f |
                             (long)dVar1))) goto LAB_00131632;
        }
        else if ((NVar2 != kSignedInteger) ||
                (((long)dVar8 <= (long)input_data &&
                 (dVar8 = dVar1, (long)input_data <= (long)dVar1)))) goto LAB_00131632;
LAB_001315b7:
        in_ST7 = in_ST6;
        if (this->warning_type_ != kIgnore) {
          uStack_260 = 0;
          local_268 = dVar8;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&word);
          poVar5 = (ostream *)std::ostream::operator<<((ostream *)&word,iVar6);
          std::operator<<(poVar5,"th data is over the range of output type");
          std::__cxx11::string::string((string *)&local_250,"x2x",&local_289);
          sptk::PrintErrorMessage(&local_250,(ostringstream *)&word);
          std::__cxx11::string::~string((string *)&local_250);
          WVar3 = this->warning_type_;
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&word);
          dVar8 = local_268;
          if (WVar3 == kExit) {
            return false;
          }
        }
      }
      if (this->is_ascii_output_ == true) {
        bVar7 = sptk::SnPrintf<double>(dVar8,local_280,0x80,buffer);
        if (!bVar7) {
          return false;
        }
        std::operator<<((ostream *)&std::cout,buffer);
        if ((iVar6 + 1) % this->num_column_ == 0) {
          std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
        }
        else {
          std::operator<<((ostream *)&std::cout,"\t");
        }
      }
      else {
        bVar7 = sptk::WriteStream<double>(dVar8,(ostream *)&std::cout);
        if (!bVar7) {
          return false;
        }
      }
    }
    iVar6 = iVar6 + 1;
  } while( true );
}

Assistant:

bool Run(std::istream* input_stream) const override {
    char buffer[kBufferSize];
    int index(0);
    for (;; ++index) {
      // Read.
      T1 input_data;
      if (is_ascii_input_) {
        std::string word;
        *input_stream >> word;
        if (word.empty()) break;
        try {
          input_data = static_cast<T1>(std::stold(word));
        } catch (std::invalid_argument&) {
          return false;
        }
      } else {
        if (!sptk::ReadStream(&input_data, input_stream)) {
          break;
        }
      }

      // Convert.
      T2 output_data(static_cast<T2>(input_data));

      bool is_clipped(false);
      {
        // Clipping.
        if (minimum_value_ < maximum_value_) {
          if (kSignedInteger == input_numeric_type_) {
            if (static_cast<std::int64_t>(input_data) <
                static_cast<std::int64_t>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<std::int64_t>(maximum_value_) <
                       static_cast<std::int64_t>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          } else if (kUnsignedInteger == input_numeric_type_) {
            if (static_cast<std::uint64_t>(input_data) <
                static_cast<std::uint64_t>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<std::uint64_t>(maximum_value_) <
                       static_cast<std::uint64_t>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          } else if (kFloatingPoint == input_numeric_type_) {
            if (static_cast<long double>(input_data) <
                static_cast<long double>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<long double>(maximum_value_) <
                       static_cast<long double>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          }
        }

        // Rounding.
        if (rounding_ && !is_clipped) {
          if (0.0 < input_data) {
            output_data = static_cast<T2>(input_data + 0.5);
          } else {
            output_data = static_cast<T2>(input_data - 0.5);
          }
        }
      }

      if (is_clipped && kIgnore != warning_type_) {
        std::ostringstream error_message;
        error_message << index << "th data is over the range of output type";
        sptk::PrintErrorMessage("x2x", error_message);
        if (kExit == warning_type_) return false;
      }

      // Write output.
      if (is_ascii_output_) {
        if (!sptk::SnPrintf(output_data, print_format_, sizeof(buffer),
                            buffer)) {
          return false;
        }
        std::cout << buffer;
        if (0 == (index + 1) % num_column_) {
          std::cout << std::endl;
        } else {
          std::cout << "\t";
        }
      } else {
        if (!sptk::WriteStream(output_data, &std::cout)) {
          return false;
        }
      }
    }

    if (is_ascii_output_ && 0 != index % num_column_) {
      std::cout << std::endl;
    }

    return true;
  }